

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hh
# Opt level: O0

system_t * __thiscall tchecker::system::system_t::operator=(system_t *this,system_t *param_1)

{
  system_t *param_1_local;
  system_t *this_local;
  
  clocks_t::operator=(&this->super_clocks_t,&param_1->super_clocks_t);
  edges_t::operator=(&this->super_edges_t,&param_1->super_edges_t);
  events_t::operator=(&this->super_events_t,&param_1->super_events_t);
  intvars_t::operator=(&this->super_intvars_t,&param_1->super_intvars_t);
  locs_t::operator=(&this->super_locs_t,&param_1->super_locs_t);
  processes_t::operator=(&this->super_processes_t,&param_1->super_processes_t);
  synchronizations_t::operator=(&this->super_synchronizations_t,&param_1->super_synchronizations_t);
  std::__cxx11::string::operator=((string *)&this->_name,(string *)&param_1->_name);
  attributes_t::operator=(&this->_attributes,&param_1->_attributes);
  return this;
}

Assistant:

tchecker::system::system_t & operator=(tchecker::system::system_t const &) = default;